

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O0

pool_ptr<soul::heart::Function> __thiscall soul::Module::Functions::findRunFunction(Functions *this)

{
  char *__str;
  size_t in_RSI;
  string_view name;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Functions *this_local;
  
  this_local = this;
  __str = heart::getRunFunctionName();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,__str);
  name._M_str = (char *)local_28._M_len;
  name._M_len = in_RSI;
  find(this,name);
  return (pool_ptr<soul::heart::Function>)(Function *)this;
}

Assistant:

pool_ptr<heart::Function> Module::Functions::findRunFunction() const        { return find (heart::getRunFunctionName()); }